

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_3x3.h
# Opt level: O1

void ncnn::conv3x3s2_sse(Mat *bottom_blob,Mat *top_blob,Mat *_kernel,Mat *_bias,Option *opt)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float fVar6;
  float fVar7;
  undefined8 uVar8;
  int iVar9;
  uint uVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  void *pvVar14;
  void *pvVar15;
  void *pvVar16;
  size_t sVar17;
  size_t sVar18;
  void *pvVar19;
  long lVar20;
  int iVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  uint uVar25;
  int iVar26;
  long lVar27;
  ulong uVar28;
  long lVar29;
  float *pfVar30;
  long lVar31;
  float *pfVar32;
  int iVar33;
  float *pfVar34;
  float *pfVar35;
  int iVar36;
  undefined1 auVar37 [16];
  undefined4 uVar38;
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  int remain;
  
  auVar24 = _DAT_0015cc50;
  auVar23 = _DAT_0015cc40;
  auVar22 = _DAT_0015ca10;
  iVar9 = top_blob->c;
  if (0 < (long)iVar9) {
    uVar10 = bottom_blob->c;
    iVar11 = top_blob->w;
    iVar12 = top_blob->h;
    pvVar14 = _kernel->data;
    pvVar15 = _bias->data;
    iVar13 = bottom_blob->w;
    iVar21 = (iVar13 - iVar11) * 2;
    lVar29 = top_blob->cstep * top_blob->elemsize;
    pvVar16 = top_blob->data;
    uVar25 = top_blob->h * top_blob->w;
    lVar27 = (ulong)uVar25 - 1;
    auVar37._8_4_ = (int)lVar27;
    auVar37._0_8_ = lVar27;
    auVar37._12_4_ = (int)((ulong)lVar27 >> 0x20);
    sVar17 = bottom_blob->cstep;
    sVar18 = bottom_blob->elemsize;
    pvVar19 = bottom_blob->data;
    auVar37 = auVar37 ^ _DAT_0015ca10;
    lVar27 = (long)pvVar16 + 0xc;
    lVar31 = 0;
    do {
      if (pvVar15 == (void *)0x0) {
        uVar38 = 0;
      }
      else {
        uVar38 = *(undefined4 *)((long)pvVar15 + lVar31 * 4);
      }
      if (0 < (int)uVar25) {
        uVar28 = 0;
        do {
          auVar39._8_4_ = (int)uVar28;
          auVar39._0_8_ = uVar28;
          auVar39._12_4_ = (int)(uVar28 >> 0x20);
          auVar40 = (auVar39 | auVar24) ^ auVar22;
          iVar26 = auVar37._4_4_;
          if ((bool)(~(iVar26 < auVar40._4_4_ ||
                      auVar37._0_4_ < auVar40._0_4_ && auVar40._4_4_ == iVar26) & 1)) {
            *(undefined4 *)(lVar27 + -0xc + uVar28 * 4) = uVar38;
          }
          if (auVar40._12_4_ <= auVar37._12_4_ &&
              (auVar40._8_4_ <= auVar37._8_4_ || auVar40._12_4_ != auVar37._12_4_)) {
            *(undefined4 *)(lVar27 + -8 + uVar28 * 4) = uVar38;
          }
          auVar39 = (auVar39 | auVar23) ^ auVar22;
          iVar36 = auVar39._4_4_;
          if (iVar36 <= iVar26 && (iVar36 != iVar26 || auVar39._0_4_ <= auVar37._0_4_)) {
            *(undefined4 *)(lVar27 + -4 + uVar28 * 4) = uVar38;
            *(undefined4 *)(lVar27 + uVar28 * 4) = uVar38;
          }
          uVar28 = uVar28 + 4;
        } while ((uVar25 + 3 & 0xfffffffc) != uVar28);
      }
      if (0 < (int)uVar10) {
        iVar26 = uVar10 * 9 * (int)lVar31;
        uVar28 = 0;
        do {
          if (0 < iVar12) {
            lVar20 = uVar28 * 0x24;
            pfVar30 = (float *)(sVar17 * sVar18 * uVar28 + (long)pvVar19);
            pfVar32 = pfVar30 + (long)iVar13 * 2;
            pfVar34 = pfVar30 + iVar13;
            iVar36 = 0;
            pfVar35 = (float *)(lVar29 * lVar31 + (long)pvVar16);
            do {
              iVar33 = iVar11 + 1;
              if (0 < iVar11) {
                do {
                  pfVar1 = pfVar30 + 1;
                  fVar6 = *pfVar30;
                  pfVar30 = pfVar30 + 2;
                  fVar7 = *pfVar34;
                  pfVar2 = pfVar34 + 1;
                  pfVar34 = pfVar34 + 2;
                  pfVar4 = (float *)((long)pvVar14 + lVar20 + (long)iVar26 * 4);
                  pfVar5 = (float *)((long)pvVar14 + lVar20 + (long)iVar26 * 4 + 0x10);
                  uVar8 = *(undefined8 *)pfVar32;
                  pfVar3 = pfVar32 + 2;
                  pfVar32 = pfVar32 + 2;
                  *pfVar35 = (float)((ulong)uVar8 >> 0x20) * pfVar5[3] + fVar7 * pfVar4[3] +
                             (float)((ulong)*(undefined8 *)pfVar2 >> 0x20) * pfVar5[1] +
                             (float)*(undefined8 *)pfVar1 * pfVar4[1] +
                             (float)uVar8 * pfVar5[2] +
                             (float)((ulong)*(undefined8 *)pfVar1 >> 0x20) * pfVar4[2] +
                             (float)*(undefined8 *)pfVar2 * *pfVar5 + fVar6 * *pfVar4 +
                             *(float *)((long)pvVar14 + lVar20 + (long)iVar26 * 4 + 0x20) * *pfVar3
                             + *pfVar35;
                  pfVar35 = pfVar35 + 1;
                  iVar33 = iVar33 + -1;
                } while (1 < iVar33);
              }
              pfVar30 = pfVar30 + iVar21;
              pfVar34 = pfVar34 + iVar21;
              pfVar32 = pfVar32 + iVar21;
              iVar36 = iVar36 + 1;
            } while (iVar36 != iVar12);
          }
          uVar28 = uVar28 + 1;
        } while (uVar28 != uVar10);
      }
      lVar31 = lVar31 + 1;
      lVar27 = lVar27 + lVar29;
    } while (lVar31 != iVar9);
  }
  return;
}

Assistant:

static void conv3x3s2_sse(const Mat &bottom_blob, Mat &top_blob, const Mat &_kernel, const Mat& _bias, const Option& opt)
{
    int w = bottom_blob.w;
    int inch = bottom_blob.c;

    int outw = top_blob.w;
    int outh = top_blob.h;
    int outch = top_blob.c;

    const int tailstep = w - 2 * outw + w;

    const float* kernel = _kernel;
    const float* bias = _bias;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p = 0; p < outch; p++)
    {
        Mat out = top_blob.channel(p);

        const float bias0 = bias ? bias[p] : 0.f;

        out.fill(bias0);

        for (int q = 0; q < inch; q++)
        {
            float *outptr = out;

            const float *img = bottom_blob.channel(q);
            const float* kernel0 = kernel + p*inch*9  + q*9;

            const float *r0 = img;
            const float *r1 = img + w;
            const float *r2 = img + w * 2;

            const float* k0 = kernel0;
            const float* k1 = kernel0 + 3;
            const float* k2 = kernel0 + 6;

            for (int i = 0; i < outh; i++)
            {
                int remain = outw;

                for (; remain > 0; remain--)
                {
                    float sum = 0;

                    sum += r0[0] * k0[0];
                    sum += r0[1] * k0[1];
                    sum += r0[2] * k0[2];
                    sum += r1[0] * k1[0];
                    sum += r1[1] * k1[1];
                    sum += r1[2] * k1[2];
                    sum += r2[0] * k2[0];
                    sum += r2[1] * k2[1];
                    sum += r2[2] * k2[2];

                    *outptr += sum;

                    r0 += 2;
                    r1 += 2;
                    r2 += 2;
                    outptr++;
                }

                r0 += tailstep;
                r1 += tailstep;
                r2 += tailstep;
            }
        }
    }
}